

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_edge_uintwide_t_backend(void)

{
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  int in_R8D;
  int iVar1;
  bool bVar2;
  local_small_uintwide_t_type gcd_max;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  type gcd_uv;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  v;
  number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
  u;
  
  boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>::
  uintwide_t_backend<long,_nullptr>(&gcd_max.m_backend,0);
  iVar1 = 0x40;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              (&u,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    a = (number<boost::multiprecision::uintwide_t_backend<256U,_unsigned_int,_void>,_(boost::multiprecision::expression_template_option)0>
         *)0x4d;
    generate_wide_integer_value<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>,(boost::multiprecision::expression_template_option)0>>
              (&v,(test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[4] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[4];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[5] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[5];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[0] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[0];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[1] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[1];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[2] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[2];
    result.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[3] =
         u.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[3];
    math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::negate
              ((uintwide_t<256U,_unsigned_int,_void,_false> *)&result);
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[4] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[4];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[5] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[5];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[6];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[7];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[0] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[0];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[1] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[1];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[2] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[2];
    result_1.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[3] =
         v.m_backend.m_value.values.super_array<unsigned_int,_8UL>.elems[3];
    math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_false>::negate
              ((uintwide_t<256U,_unsigned_int,_void,_false> *)&result_1);
    boost::multiprecision::gcd<boost::multiprecision::uintwide_t_backend<256u,unsigned_int,void>>
              (&gcd_uv,(multiprecision *)&result,&result_1,a);
    boost::multiprecision::eval_gt<256u,unsigned_int,void>(&gcd_uv.m_backend,&gcd_max.m_backend);
  }
  bVar2 = boost::multiprecision::eval_gt<256U,_unsigned_int,_void,_long,_nullptr>
                    (&gcd_max.m_backend,0);
  return bVar2;
}

Assistant:

auto test_edge_uintwide_t_backend() -> bool
{
  using local_small_uintwide_t_backend_type = boost::multiprecision::uintwide_t_backend<local_edge_cases::local_digits2_small>;

  using local_small_uintwide_t_type = boost::multiprecision::number<local_small_uintwide_t_backend_type, boost::multiprecision::et_off>;

  auto result_is_ok = true;

  {
    // This odd-looking code is intended to pick up some non-covered lines
    // in the Boost-intended uintwide_t_backend class.

    local_small_uintwide_t_type gcd_max { 0 };

    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(UINT32_C(64));
             ++i)
    {
      const auto u = generate_wide_integer_value<local_small_uintwide_t_type>();
      const auto v = generate_wide_integer_value<local_small_uintwide_t_type>();

      const auto gcd_uv = gcd(-u, -v);

      if(gcd_uv > gcd_max)
      {
        gcd_max = gcd_uv;
      }
    }

    const bool result_gcd_is_ok = (gcd_max > 0);

    result_is_ok = (result_gcd_is_ok && result_is_ok);
  }

  return result_is_ok;
}